

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_affine_avx2.c
# Opt level: O3

void av1_highbd_warp_affine_avx2
               (int32_t *mat,uint16_t *ref,int width,int height,int stride,uint16_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               int bd,ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,
               int16_t delta)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  byte bVar8;
  byte bVar9;
  byte bVar10;
  ushort uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  undefined4 uVar34;
  short sVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  undefined2 uVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  undefined2 uVar44;
  int iVar45;
  int iVar46;
  undefined1 (*pauVar47) [32];
  uint uVar48;
  long lVar49;
  int iVar50;
  ulong uVar51;
  uint uVar52;
  int iVar53;
  uint uVar54;
  int iVar55;
  uint uVar56;
  int iVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  ushort uVar83;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  __m256i round_const;
  int32_t tmp1 [8];
  __m256i tmp [15];
  int local_48c;
  int local_474;
  undefined1 local_260 [32];
  undefined1 local_240 [224];
  undefined1 local_160 [304];
  
  uVar3 = conv_params->round_0;
  if (conv_params->is_compound == 0) {
    uVar48 = 0xe - uVar3;
    uVar56 = conv_params->round_1;
  }
  else {
    uVar56 = conv_params->round_1;
    uVar48 = uVar56;
  }
  uVar44 = 0xff;
  if (bd == 0xc) {
    uVar44 = 0xfff;
  }
  uVar39 = 0x3ff;
  if (bd != 10) {
    uVar39 = uVar44;
  }
  bVar8 = (byte)bd;
  uVar52 = 1 << (bVar8 + 6 & 0x1f);
  if (0 < p_height) {
    uVar54 = 0xe - (uVar56 + uVar3);
    iVar1 = conv_params->fwd_offset;
    iVar2 = conv_params->bck_offset;
    bVar9 = (byte)uVar3;
    bVar10 = (bVar8 + 0xe) - (char)(uVar56 + uVar3);
    iVar45 = (-1 << (bVar10 & 0x1f)) + (-1 << (bVar10 - 1 & 0x1f)) +
             ((1 << ((byte)uVar54 & 0x1f)) >> 1);
    iVar55 = (1 << ((byte)uVar48 & 0x1f)) >> 1;
    iVar40 = (1 << (bVar9 - 1 & 0x1f)) + uVar52;
    iVar50 = (1 << ((bVar8 + 0xe) - bVar9 & 0x1f)) + iVar55;
    iVar38 = (int)alpha;
    iVar41 = 1 << ((bVar9 ^ 0xff) + bVar8 + 7 & 0x1f);
    iVar55 = (-1 << (((byte)uVar48 + bVar8) - 1 & 0x1f)) + iVar55;
    iVar46 = (int)beta;
    uVar11 = (ushort)(-1 << (bVar8 & 0x1f));
    uVar83 = uVar11 ^ 0xffff;
    iVar30 = (int)gamma;
    iVar42 = iVar46 * -3 + 0x10200;
    auVar65._4_4_ = iVar50;
    auVar65._0_4_ = iVar50;
    auVar65._8_4_ = iVar50;
    auVar65._12_4_ = iVar50;
    auVar65._16_4_ = iVar50;
    auVar65._20_4_ = iVar50;
    auVar65._24_4_ = iVar50;
    auVar65._28_4_ = iVar50;
    iVar21 = height + -1;
    lVar26 = (long)height;
    iVar22 = width + -1;
    auVar92._4_4_ = iVar22;
    auVar92._0_4_ = iVar22;
    auVar92._8_4_ = iVar22;
    auVar92._12_4_ = iVar22;
    auVar92._16_4_ = iVar22;
    auVar92._20_4_ = iVar22;
    auVar92._24_4_ = iVar22;
    auVar92._28_4_ = iVar22;
    auVar4 = vpmovsxbd_avx(ZEXT416(0x3020104));
    auVar5 = vpmovsxbq_avx2(ZEXT416(0xf8f9fafb));
    local_48c = 0;
    iVar50 = 0;
    auVar6 = vpmovsxbq_avx2(ZEXT416(0xfcfdfeff));
    do {
      if (0 < p_width) {
        lVar27 = (long)(p_row + 4 + iVar50 << ((byte)subsampling_y & 0x1f));
        iVar31 = p_height - iVar50;
        iVar23 = 8;
        if (iVar31 < 8) {
          iVar23 = iVar31;
        }
        lVar43 = (long)iVar23;
        iVar32 = 0;
        local_474 = local_48c;
        do {
          lVar28 = (long)(p_col + 4 + iVar32 << ((byte)subsampling_x & 0x1f));
          lVar29 = (long)mat[1] + mat[5] * lVar27 + mat[4] * lVar28 >> ((byte)subsampling_y & 0x3f);
          uVar56 = (uint)((long)*mat + mat[3] * lVar27 + mat[2] * lVar28 >>
                         ((byte)subsampling_x & 0x3f));
          iVar33 = (int)uVar56 >> 0x10;
          sVar35 = (short)((ulong)lVar29 >> 0x10);
          if (iVar33 < -6) {
            if (iVar31 < -6) goto LAB_0046a5b9;
            lVar28 = (long)sVar35 + -7;
            lVar37 = -7;
            pauVar47 = (undefined1 (*) [32])local_240;
            do {
              iVar33 = iVar21;
              if (lVar28 < lVar26) {
                iVar33 = (int)lVar28;
              }
              if (lVar28 < 0) {
                iVar33 = 0;
              }
              auVar58._0_2_ =
                   (undefined2)(((uint)ref[iVar33 * stride] << (7 - bVar9 & 0x1f)) + iVar41);
              auVar58._2_2_ = auVar58._0_2_;
              auVar58._4_2_ = auVar58._0_2_;
              auVar58._6_2_ = auVar58._0_2_;
              auVar58._8_2_ = auVar58._0_2_;
              auVar58._10_2_ = auVar58._0_2_;
              auVar58._12_2_ = auVar58._0_2_;
              auVar58._14_2_ = auVar58._0_2_;
              auVar62 = vpmovsxwd_avx2(auVar58);
              *pauVar47 = auVar62;
              lVar37 = lVar37 + 1;
              pauVar47 = pauVar47 + 1;
              lVar28 = lVar28 + 1;
            } while (lVar37 < lVar43);
LAB_0046a2f7:
            if (0 < iVar31) {
              iVar53 = (((uint)lVar29 & 0xfffc) + (delta + iVar30) * -4 & 0xffffffc0) + 0x10200;
              lVar28 = -4;
              pauVar47 = (undefined1 (*) [32])local_160;
              iVar33 = local_474;
              iVar57 = iVar50;
              do {
                auVar66._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar30 + iVar53 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar53 >> 10];
                auVar66._16_16_ =
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar30 + iVar53 >> 10];
                iVar24 = iVar30 * 2 + iVar53;
                iVar36 = iVar30 + iVar24;
                iVar25 = iVar30 + iVar36;
                auVar61._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar36 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar24 >> 10];
                auVar61._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar36 >> 10];
                iVar36 = iVar30 + iVar25;
                iVar24 = iVar30 + iVar36;
                auVar74._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar36 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar25 >> 10];
                auVar74._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar36 >> 10];
                auVar78._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar30 + iVar24 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar24 >> 10];
                auVar78._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar30 + iVar24 >> 10];
                auVar70 = vpunpckldq_avx2(auVar66,auVar61);
                auVar62 = vpunpckhdq_avx2(auVar66,auVar61);
                auVar71 = vpunpckldq_avx2(auVar74,auVar78);
                auVar64 = vpunpckhdq_avx2(auVar74,auVar78);
                auVar72 = vpunpcklqdq_avx2(auVar70,auVar71);
                auVar70 = vpunpckhqdq_avx2(auVar70,auVar71);
                auVar73 = vpunpcklqdq_avx2(auVar62,auVar64);
                auVar71 = vpunpckhqdq_avx2(auVar62,auVar64);
                auVar64 = vpunpckldq_avx2(pauVar47[-7],pauVar47[-6]);
                auVar62 = vpunpckhdq_avx2(pauVar47[-7],pauVar47[-6]);
                auVar62 = vpackusdw_avx2(auVar64,auVar62);
                auVar64 = vpmaddwd_avx2(auVar62,auVar72);
                auVar72 = vpunpckldq_avx2(pauVar47[-5],pauVar47[-4]);
                auVar62 = vpunpckhdq_avx2(pauVar47[-5],pauVar47[-4]);
                auVar62 = vpackusdw_avx2(auVar72,auVar62);
                auVar62 = vpmaddwd_avx2(auVar62,auVar70);
                auVar64 = vpaddd_avx2(auVar62,auVar64);
                auVar70 = vpunpckldq_avx2(pauVar47[-3],pauVar47[-2]);
                auVar62 = vpunpckhdq_avx2(pauVar47[-3],pauVar47[-2]);
                auVar62 = vpackusdw_avx2(auVar70,auVar62);
                auVar70 = vpmaddwd_avx2(auVar62,auVar73);
                auVar72 = vpunpckldq_avx2(pauVar47[-1],*pauVar47);
                auVar62 = vpunpckhdq_avx2(pauVar47[-1],*pauVar47);
                auVar62 = vpackusdw_avx2(auVar72,auVar62);
                auVar62 = vpmaddwd_avx2(auVar62,auVar71);
                auVar62 = vpaddd_avx2(auVar70,auVar62);
                auVar62 = vpaddd_avx2(auVar64,auVar62);
                auVar64 = vpmovsxbd_avx2(ZEXT816(0x703060205010400));
                auVar62 = vpermd_avx2(auVar64,auVar62);
                if (conv_params->is_compound == 0) {
                  auVar18._4_4_ = iVar55;
                  auVar18._0_4_ = iVar55;
                  auVar18._8_4_ = iVar55;
                  auVar18._12_4_ = iVar55;
                  auVar18._16_4_ = iVar55;
                  auVar18._20_4_ = iVar55;
                  auVar18._24_4_ = iVar55;
                  auVar18._28_4_ = iVar55;
                  auVar62 = vpaddd_avx2(auVar62,auVar18);
                  auVar62 = vpsrad_avx2(auVar62,ZEXT416(uVar48));
                  auVar60 = vpackusdw_avx(auVar62._0_16_,auVar62._16_16_);
                  auVar17._8_2_ = uVar83;
                  auVar17._0_8_ =
                       CONCAT26(uVar11,CONCAT24(uVar11,CONCAT22(uVar11,uVar11))) ^
                       0xffffffffffffffff;
                  auVar17._10_2_ = uVar83;
                  auVar17._12_2_ = uVar83;
                  auVar17._14_2_ = uVar83;
                  auVar60 = vpminsw_avx(auVar60,auVar17);
                  auVar60 = vpmaxsw_avx(auVar60,_DAT_004c9010);
LAB_0046a589:
                  *(undefined1 (*) [16])(pred + iVar33) = auVar60;
                }
                else {
                  iVar24 = conv_params->dst_stride * iVar57 + iVar32;
                  auVar62 = vpaddd_avx2(auVar62,auVar65);
                  auVar62 = vpsrad_avx2(auVar62,ZEXT416(uVar48));
                  if (conv_params->do_average != 0) {
                    auVar64 = vpmovzxwd_avx2(*(undefined1 (*) [16])(conv_params->dst + iVar24));
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      auVar62 = vpaddd_avx2(auVar62,auVar64);
                      auVar62 = vpsrad_avx2(auVar62,1);
                    }
                    else {
                      auVar16._4_4_ = iVar1;
                      auVar16._0_4_ = iVar1;
                      auVar16._8_4_ = iVar1;
                      auVar16._12_4_ = iVar1;
                      auVar16._16_4_ = iVar1;
                      auVar16._20_4_ = iVar1;
                      auVar16._24_4_ = iVar1;
                      auVar16._28_4_ = iVar1;
                      auVar64 = vpmulld_avx2(auVar64,auVar16);
                      auVar15._4_4_ = iVar2;
                      auVar15._0_4_ = iVar2;
                      auVar15._8_4_ = iVar2;
                      auVar15._12_4_ = iVar2;
                      auVar15._16_4_ = iVar2;
                      auVar15._20_4_ = iVar2;
                      auVar15._24_4_ = iVar2;
                      auVar15._28_4_ = iVar2;
                      auVar62 = vpmulld_avx2(auVar62,auVar15);
                      auVar62 = vpaddd_avx2(auVar64,auVar62);
                      auVar62 = vpsrad_avx2(auVar62,4);
                    }
                    auVar19._4_4_ = iVar45;
                    auVar19._0_4_ = iVar45;
                    auVar19._8_4_ = iVar45;
                    auVar19._12_4_ = iVar45;
                    auVar19._16_4_ = iVar45;
                    auVar19._20_4_ = iVar45;
                    auVar19._24_4_ = iVar45;
                    auVar19._28_4_ = iVar45;
                    auVar62 = vpaddd_avx2(auVar62,auVar19);
                    auVar62 = vpsrad_avx2(auVar62,ZEXT416(uVar54));
                    auVar60 = vpackusdw_avx(auVar62._0_16_,auVar62._16_16_);
                    auVar20._2_2_ = uVar39;
                    auVar20._0_2_ = uVar39;
                    auVar20._4_2_ = uVar39;
                    auVar20._6_2_ = uVar39;
                    auVar20._8_2_ = uVar39;
                    auVar20._10_2_ = uVar39;
                    auVar20._12_2_ = uVar39;
                    auVar20._14_2_ = uVar39;
                    auVar60 = vpminsw_avx(auVar60,auVar20);
                    goto LAB_0046a589;
                  }
                  auVar60 = vpackusdw_avx(auVar62._0_16_,auVar62._16_16_);
                  *(undefined1 (*) [16])(conv_params->dst + iVar24) = auVar60;
                }
                lVar28 = lVar28 + 1;
                pauVar47 = pauVar47 + 1;
                iVar53 = iVar53 + delta;
                iVar33 = iVar33 + p_stride;
                iVar57 = iVar57 + 1;
              } while (lVar28 < iVar23 + -4);
            }
          }
          else {
            if (width + 6 <= iVar33) {
              if (iVar31 < -6) goto LAB_0046a5b9;
              lVar28 = (long)sVar35 + -7;
              lVar37 = -7;
              pauVar47 = (undefined1 (*) [32])local_240;
              do {
                iVar33 = iVar21;
                if (lVar28 < lVar26) {
                  iVar33 = (int)lVar28;
                }
                if (lVar28 < 0) {
                  iVar33 = 0;
                }
                auVar60._0_2_ =
                     (undefined2)
                     (((uint)ref[iVar33 * stride + iVar22] << (7 - bVar9 & 0x1f)) + iVar41);
                auVar60._2_2_ = auVar60._0_2_;
                auVar60._4_2_ = auVar60._0_2_;
                auVar60._6_2_ = auVar60._0_2_;
                auVar60._8_2_ = auVar60._0_2_;
                auVar60._10_2_ = auVar60._0_2_;
                auVar60._12_2_ = auVar60._0_2_;
                auVar60._14_2_ = auVar60._0_2_;
                auVar62 = vpmovsxwd_avx2(auVar60);
                *pauVar47 = auVar62;
                lVar37 = lVar37 + 1;
                pauVar47 = pauVar47 + 1;
                lVar28 = lVar28 + 1;
              } while (lVar37 < lVar43);
              goto LAB_0046a2f7;
            }
            uVar56 = (uVar56 & 0xfffc) + (iVar46 + iVar38) * -4 & 0xffffffc0;
            iVar57 = uVar56 + 0x10200;
            if (width < iVar33 + 9 || iVar33 < 7) {
              if (-7 < iVar31) {
                lVar28 = -7;
                do {
                  iVar24 = (int)(sVar35 + lVar28);
                  iVar53 = iVar21;
                  if (iVar24 < iVar21) {
                    iVar53 = iVar24;
                  }
                  if (sVar35 + lVar28 < 0) {
                    iVar53 = 0;
                  }
                  iVar53 = iVar53 * stride;
                  iVar24 = ((int)lVar28 + 4) * iVar46 + iVar57;
                  auVar62._4_4_ = iVar53;
                  auVar62._0_4_ = iVar53;
                  auVar62._8_4_ = iVar53;
                  auVar62._12_4_ = iVar53;
                  auVar62._16_4_ = iVar53;
                  auVar62._20_4_ = iVar53;
                  auVar62._24_4_ = iVar53;
                  auVar62._28_4_ = iVar53;
                  uVar56 = 0;
                  uVar51 = 0;
                  do {
                    lVar37 = (long)iVar33 + -7 + uVar51;
                    uVar34 = (undefined4)lVar37;
                    iVar53 = (int)uVar51;
                    iVar25 = iVar33 + -2 + iVar53;
                    iVar36 = iVar33 + -1 + iVar53;
                    iVar53 = iVar33 + iVar53;
                    auVar59._4_4_ = uVar34;
                    auVar59._0_4_ = uVar34;
                    auVar59._8_4_ = uVar34;
                    auVar59._12_4_ = uVar34;
                    auVar60 = vpaddd_avx(auVar4,auVar59);
                    auVar64 = vpermq_avx2(ZEXT1632(auVar60),0xc4);
                    auVar64 = vpblendd_avx2(auVar64,ZEXT1632(auVar59),1);
                    auVar70._4_4_ = iVar25;
                    auVar70._0_4_ = iVar25;
                    auVar70._8_4_ = iVar25;
                    auVar70._12_4_ = iVar25;
                    auVar70._16_4_ = iVar25;
                    auVar70._20_4_ = iVar25;
                    auVar70._24_4_ = iVar25;
                    auVar70._28_4_ = iVar25;
                    auVar64 = vpblendd_avx2(auVar64,auVar70,0x20);
                    auVar71._4_4_ = iVar36;
                    auVar71._0_4_ = iVar36;
                    auVar71._8_4_ = iVar36;
                    auVar71._12_4_ = iVar36;
                    auVar71._16_4_ = iVar36;
                    auVar71._20_4_ = iVar36;
                    auVar71._24_4_ = iVar36;
                    auVar71._28_4_ = iVar36;
                    auVar64 = vpblendd_avx2(auVar64,auVar71,0x40);
                    auVar72._4_4_ = iVar53;
                    auVar72._0_4_ = iVar53;
                    auVar72._8_4_ = iVar53;
                    auVar72._12_4_ = iVar53;
                    auVar72._16_4_ = iVar53;
                    auVar72._20_4_ = iVar53;
                    auVar72._24_4_ = iVar53;
                    auVar72._28_4_ = iVar53;
                    auVar70 = vpblendd_avx2(auVar64,auVar72,0x80);
                    auVar73._8_8_ = lVar37;
                    auVar73._0_8_ = lVar37;
                    auVar73._16_8_ = lVar37;
                    auVar73._24_8_ = lVar37;
                    auVar64 = vpcmpgtq_avx2(auVar73,auVar5);
                    auVar71 = vpminsd_avx2(auVar70,auVar92);
                    auVar70 = vpcmpgtq_avx2(auVar73,auVar6);
                    auVar64 = vpackssdw_avx2(auVar70,auVar64);
                    auVar64 = vpermq_avx2(auVar64,0xd8);
                    auVar64 = vblendvps_avx(ZEXT1632(ZEXT816(0) << 0x40),auVar71,auVar64);
                    auVar70 = vpmovsxwd_avx2((undefined1  [16])av1_warped_filter[iVar24 >> 10]);
                    auVar64 = vpaddd_avx2(auVar64,auVar62);
                    auVar60 = vpinsrw_avx(ZEXT216(ref[auVar64._0_4_]),(uint)ref[auVar64._4_4_],1);
                    auVar60 = vpinsrw_avx(auVar60,(uint)ref[auVar64._8_4_],2);
                    auVar60 = vpinsrw_avx(auVar60,(uint)ref[auVar64._12_4_],3);
                    auVar60 = vpinsrw_avx(auVar60,(uint)ref[auVar64._16_4_],4);
                    auVar60 = vpinsrw_avx(auVar60,(uint)ref[auVar64._20_4_],5);
                    auVar60 = vpinsrw_avx(auVar60,(uint)ref[auVar64._24_4_],6);
                    auVar60 = vpinsrw_avx(auVar60,(uint)ref[auVar64._28_4_],7);
                    auVar64 = vpmovzxwd_avx2(auVar60);
                    auVar64 = vpmulld_avx2(auVar70,auVar64);
                    auVar60 = vphaddd_avx(auVar64._0_16_,auVar64._16_16_);
                    auVar64 = vpaddd_avx2(ZEXT1632(auVar60),ZEXT432(uVar52));
                    auVar60 = vphaddd_avx(auVar64._16_16_,auVar64._0_16_);
                    auVar60 = vphaddd_avx(auVar60,auVar60);
                    auVar60 = vphaddd_avx(auVar60,auVar60);
                    *(int *)(local_260 +
                            (ulong)((uVar56 & 4) + ((uint)(uVar51 >> 1) & 0x7fffffff)) * 4) =
                         auVar60._0_4_ + ((1 << (bVar9 & 0x1f)) >> 1) >> (bVar9 & 0x1f);
                    iVar24 = iVar24 + iVar38;
                    uVar56 = uVar56 + 4;
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != 8);
                  *(undefined1 (*) [32])(local_160 + lVar28 * 0x20) = local_260;
                  lVar28 = lVar28 + 1;
                } while (lVar28 < lVar43);
              }
              goto LAB_0046a2f7;
            }
            auVar60 = ZEXT416(uVar3);
            iVar53 = iVar57 >> 10;
            if (beta == 0 && alpha == 0) {
              if (-7 < iVar31) {
                uVar34 = *(undefined4 *)av1_warped_filter[iVar53];
                auVar64._4_4_ = uVar34;
                auVar64._0_4_ = uVar34;
                auVar64._8_4_ = uVar34;
                auVar64._12_4_ = uVar34;
                auVar64._16_4_ = uVar34;
                auVar64._20_4_ = uVar34;
                auVar64._24_4_ = uVar34;
                auVar64._28_4_ = uVar34;
                uVar34 = *(undefined4 *)(av1_warped_filter[iVar53] + 2);
                auVar76._4_4_ = uVar34;
                auVar76._0_4_ = uVar34;
                auVar76._8_4_ = uVar34;
                auVar76._12_4_ = uVar34;
                auVar76._16_4_ = uVar34;
                auVar76._20_4_ = uVar34;
                auVar76._24_4_ = uVar34;
                auVar76._28_4_ = uVar34;
                uVar34 = *(undefined4 *)(av1_warped_filter[iVar53] + 4);
                auVar80._4_4_ = uVar34;
                auVar80._0_4_ = uVar34;
                auVar80._8_4_ = uVar34;
                auVar80._12_4_ = uVar34;
                auVar80._16_4_ = uVar34;
                auVar80._20_4_ = uVar34;
                auVar80._24_4_ = uVar34;
                auVar80._28_4_ = uVar34;
                uVar34 = *(undefined4 *)(av1_warped_filter[iVar53] + 6);
                auVar90._4_4_ = uVar34;
                auVar90._0_4_ = uVar34;
                auVar90._8_4_ = uVar34;
                auVar90._12_4_ = uVar34;
                auVar90._16_4_ = uVar34;
                auVar90._20_4_ = uVar34;
                auVar90._24_4_ = uVar34;
                auVar90._28_4_ = uVar34;
                lVar28 = (long)sVar35 + -7;
                lVar37 = -7;
                pauVar47 = (undefined1 (*) [32])local_240;
                do {
                  iVar57 = iVar21;
                  if (lVar28 < lVar26) {
                    iVar57 = (int)lVar28;
                  }
                  if (lVar28 < 0) {
                    iVar57 = 0;
                  }
                  lVar49 = (long)(iVar57 * stride + iVar33);
                  auVar88._16_16_ = *(undefined1 (*) [16])(ref + lVar49 + 1);
                  auVar88._0_16_ = *(undefined1 (*) [16])(ref + lVar49 + 1);
                  auVar62 = vpalignr_avx2(auVar88,*(undefined1 (*) [32])(ref + lVar49 + -7),2);
                  auVar7 = vperm2i128_avx2(*(undefined1 (*) [32])(ref + lVar49 + -7),auVar62,0x20);
                  auVar73 = vpblendd_avx2(auVar88,auVar62,0xf0);
                  auVar70 = vpmaddwd_avx2(auVar7,auVar64);
                  auVar62 = vpalignr_avx2(auVar73,auVar7,4);
                  auVar71 = vpmaddwd_avx2(auVar62,auVar76);
                  auVar62 = vpalignr_avx2(auVar73,auVar7,8);
                  auVar72 = vpmaddwd_avx2(auVar80,auVar62);
                  auVar62 = vpalignr_avx2(auVar73,auVar7,0xc);
                  auVar62 = vpmaddwd_avx2(auVar90,auVar62);
                  auVar62 = vpaddd_avx2(auVar72,auVar62);
                  auVar7._4_4_ = iVar40;
                  auVar7._0_4_ = iVar40;
                  auVar7._8_4_ = iVar40;
                  auVar7._12_4_ = iVar40;
                  auVar7._16_4_ = iVar40;
                  auVar7._20_4_ = iVar40;
                  auVar7._24_4_ = iVar40;
                  auVar7._28_4_ = iVar40;
                  auVar70 = vpaddd_avx2(auVar70,auVar7);
                  auVar70 = vpaddd_avx2(auVar71,auVar70);
                  auVar62 = vpaddd_avx2(auVar70,auVar62);
                  auVar62 = vpsrad_avx2(auVar62,auVar60);
                  *pauVar47 = auVar62;
                  lVar37 = lVar37 + 1;
                  pauVar47 = pauVar47 + 1;
                  lVar28 = lVar28 + 1;
                } while (lVar37 < lVar43);
                goto LAB_0046a2f7;
              }
            }
            else if (alpha == 0) {
              if (-7 < iVar31) {
                iVar57 = uVar56 + iVar42;
                lVar28 = (long)sVar35 + -7;
                lVar37 = -7;
                pauVar47 = (undefined1 (*) [32])local_240;
                do {
                  iVar53 = iVar21;
                  if (lVar28 < lVar26) {
                    iVar53 = (int)lVar28;
                  }
                  if (lVar28 < 0) {
                    iVar53 = 0;
                  }
                  lVar49 = (long)(iVar53 * stride + iVar33);
                  auVar68._16_16_ = *(undefined1 (*) [16])(ref + lVar49 + 1);
                  auVar68._0_16_ = *(undefined1 (*) [16])(ref + lVar49 + 1);
                  iVar53 = iVar57 >> 10;
                  uVar34 = *(undefined4 *)av1_warped_filter[iVar53];
                  auVar77._4_4_ = uVar34;
                  auVar77._0_4_ = uVar34;
                  auVar77._8_4_ = uVar34;
                  auVar77._12_4_ = uVar34;
                  auVar77._16_4_ = uVar34;
                  auVar77._20_4_ = uVar34;
                  auVar77._24_4_ = uVar34;
                  auVar77._28_4_ = uVar34;
                  uVar34 = *(undefined4 *)(av1_warped_filter[iVar53] + 2);
                  auVar81._4_4_ = uVar34;
                  auVar81._0_4_ = uVar34;
                  auVar81._8_4_ = uVar34;
                  auVar81._12_4_ = uVar34;
                  auVar81._16_4_ = uVar34;
                  auVar81._20_4_ = uVar34;
                  auVar81._24_4_ = uVar34;
                  auVar81._28_4_ = uVar34;
                  uVar34 = *(undefined4 *)(av1_warped_filter[iVar53] + 4);
                  auVar84._4_4_ = uVar34;
                  auVar84._0_4_ = uVar34;
                  auVar84._8_4_ = uVar34;
                  auVar84._12_4_ = uVar34;
                  auVar84._16_4_ = uVar34;
                  auVar84._20_4_ = uVar34;
                  auVar84._24_4_ = uVar34;
                  auVar84._28_4_ = uVar34;
                  uVar34 = *(undefined4 *)(av1_warped_filter[iVar53] + 6);
                  auVar89._4_4_ = uVar34;
                  auVar89._0_4_ = uVar34;
                  auVar89._8_4_ = uVar34;
                  auVar89._12_4_ = uVar34;
                  auVar89._16_4_ = uVar34;
                  auVar89._20_4_ = uVar34;
                  auVar89._24_4_ = uVar34;
                  auVar89._28_4_ = uVar34;
                  auVar62 = vpalignr_avx2(auVar68,*(undefined1 (*) [32])(ref + lVar49 + -7),2);
                  auVar73 = vperm2i128_avx2(*(undefined1 (*) [32])(ref + lVar49 + -7),auVar62,0x20);
                  auVar72 = vpblendd_avx2(auVar68,auVar62,0xf0);
                  auVar62 = vpalignr_avx2(auVar72,auVar73,4);
                  auVar70 = vpmaddwd_avx2(auVar62,auVar81);
                  auVar62 = vpalignr_avx2(auVar72,auVar73,8);
                  auVar64 = vpmaddwd_avx2(auVar62,auVar84);
                  auVar71 = vpmaddwd_avx2(auVar77,auVar73);
                  auVar62 = vpalignr_avx2(auVar72,auVar73,0xc);
                  auVar62 = vpmaddwd_avx2(auVar89,auVar62);
                  auVar62 = vpaddd_avx2(auVar64,auVar62);
                  auVar13._4_4_ = iVar40;
                  auVar13._0_4_ = iVar40;
                  auVar13._8_4_ = iVar40;
                  auVar13._12_4_ = iVar40;
                  auVar13._16_4_ = iVar40;
                  auVar13._20_4_ = iVar40;
                  auVar13._24_4_ = iVar40;
                  auVar13._28_4_ = iVar40;
                  auVar64 = vpaddd_avx2(auVar71,auVar13);
                  auVar64 = vpaddd_avx2(auVar64,auVar70);
                  auVar62 = vpaddd_avx2(auVar64,auVar62);
                  auVar62 = vpsrad_avx2(auVar62,auVar60);
                  *pauVar47 = auVar62;
                  lVar37 = lVar37 + 1;
                  iVar57 = iVar57 + iVar46;
                  pauVar47 = pauVar47 + 1;
                  lVar28 = lVar28 + 1;
                } while (lVar37 < lVar43);
                goto LAB_0046a2f7;
              }
            }
            else if (beta == 0) {
              if (-7 < iVar31) {
                auVar91._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar57 + iVar38 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar53];
                auVar91._16_16_ =
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar57 + iVar38 >> 10];
                auVar82._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar38 * 3 + iVar57 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar38 * 2 + iVar57 >> 10];
                auVar82._16_16_ =
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar38 * 3 + iVar57 >> 10];
                auVar69._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar38 * 5 + iVar57 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar38 * 4 + iVar57 >> 10];
                auVar69._16_16_ =
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar38 * 5 + iVar57 >> 10];
                auVar85._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar57 + iVar38 * 7 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar38 * 6 + iVar57 >> 10];
                auVar85._16_16_ =
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar57 + iVar38 * 7 >> 10];
                auVar62 = vpunpckhdq_avx2(auVar91,auVar82);
                auVar64 = vpunpckhdq_avx2(auVar69,auVar85);
                auVar70 = vpunpckhqdq_avx2(auVar62,auVar64);
                auVar72 = vpunpcklqdq_avx2(auVar62,auVar64);
                auVar64 = vpunpckldq_avx2(auVar91,auVar82);
                auVar71 = vpunpckldq_avx2(auVar69,auVar85);
                auVar62 = vpunpckhqdq_avx2(auVar64,auVar71);
                auVar64 = vpunpcklqdq_avx2(auVar64,auVar71);
                lVar28 = (long)sVar35 + -7;
                lVar37 = -7;
                pauVar47 = (undefined1 (*) [32])local_240;
                do {
                  iVar57 = iVar21;
                  if (lVar28 < lVar26) {
                    iVar57 = (int)lVar28;
                  }
                  if (lVar28 < 0) {
                    iVar57 = 0;
                  }
                  lVar49 = (long)(iVar57 * stride + iVar33);
                  auVar86._16_16_ = *(undefined1 (*) [16])(ref + lVar49 + 1);
                  auVar86._0_16_ = *(undefined1 (*) [16])(ref + lVar49 + 1);
                  auVar71 = vpalignr_avx2(auVar86,*(undefined1 (*) [32])(ref + lVar49 + -7),2);
                  auVar7 = vperm2i128_avx2(*(undefined1 (*) [32])(ref + lVar49 + -7),auVar71,0x20);
                  auVar90 = vpblendd_avx2(auVar86,auVar71,0xf0);
                  auVar73 = vpmaddwd_avx2(auVar64,auVar7);
                  auVar71 = vpalignr_avx2(auVar90,auVar7,4);
                  auVar76 = vpmaddwd_avx2(auVar71,auVar62);
                  auVar71 = vpalignr_avx2(auVar90,auVar7,8);
                  auVar80 = vpmaddwd_avx2(auVar71,auVar72);
                  auVar71 = vpalignr_avx2(auVar90,auVar7,0xc);
                  auVar71 = vpmaddwd_avx2(auVar70,auVar71);
                  auVar71 = vpaddd_avx2(auVar80,auVar71);
                  auVar14._4_4_ = iVar40;
                  auVar14._0_4_ = iVar40;
                  auVar14._8_4_ = iVar40;
                  auVar14._12_4_ = iVar40;
                  auVar14._16_4_ = iVar40;
                  auVar14._20_4_ = iVar40;
                  auVar14._24_4_ = iVar40;
                  auVar14._28_4_ = iVar40;
                  auVar73 = vpaddd_avx2(auVar73,auVar14);
                  auVar73 = vpaddd_avx2(auVar76,auVar73);
                  auVar71 = vpaddd_avx2(auVar73,auVar71);
                  auVar71 = vpsrad_avx2(auVar71,auVar60);
                  *pauVar47 = auVar71;
                  lVar37 = lVar37 + 1;
                  pauVar47 = pauVar47 + 1;
                  lVar28 = lVar28 + 1;
                } while (lVar37 < lVar43);
                goto LAB_0046a2f7;
              }
            }
            else if (-7 < iVar31) {
              iVar57 = uVar56 + iVar42;
              lVar28 = (long)sVar35 + -7;
              lVar37 = -7;
              pauVar47 = (undefined1 (*) [32])local_240;
              do {
                iVar53 = iVar21;
                if (lVar28 < lVar26) {
                  iVar53 = (int)lVar28;
                }
                if (lVar28 < 0) {
                  iVar53 = 0;
                }
                auVar75._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar38 + iVar57 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar57 >> 10];
                auVar75._16_16_ =
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar38 + iVar57 >> 10];
                iVar25 = iVar38 * 2 + iVar57;
                iVar24 = iVar38 + iVar25;
                iVar36 = iVar38 + iVar24;
                auVar63._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar24 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar25 >> 10];
                auVar63._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar24 >> 10];
                iVar24 = iVar38 + iVar36;
                iVar25 = iVar38 + iVar24;
                auVar79._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar24 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar36 >> 10];
                auVar79._16_16_ = ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar24 >> 10];
                auVar67._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar38 + iVar25 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar25 >> 10];
                auVar67._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar38 + iVar25 >> 10];
                lVar49 = (long)(iVar53 * stride + iVar33);
                auVar87._16_16_ = *(undefined1 (*) [16])(ref + lVar49 + 1);
                auVar87._0_16_ = *(undefined1 (*) [16])(ref + lVar49 + 1);
                auVar70 = vpunpckldq_avx2(auVar75,auVar63);
                auVar62 = vpunpckhdq_avx2(auVar75,auVar63);
                auVar71 = vpunpckldq_avx2(auVar79,auVar67);
                auVar64 = vpunpckhdq_avx2(auVar79,auVar67);
                auVar73 = vpunpcklqdq_avx2(auVar70,auVar71);
                auVar71 = vpunpckhqdq_avx2(auVar70,auVar71);
                auVar76 = vpunpcklqdq_avx2(auVar62,auVar64);
                auVar72 = vpunpckhqdq_avx2(auVar62,auVar64);
                auVar62 = vpalignr_avx2(auVar87,*(undefined1 (*) [32])(ref + lVar49 + -7),2);
                auVar90 = vperm2i128_avx2(*(undefined1 (*) [32])(ref + lVar49 + -7),auVar62,0x20);
                auVar80 = vpblendd_avx2(auVar87,auVar62,0xf0);
                auVar70 = vpmaddwd_avx2(auVar73,auVar90);
                auVar62 = vpalignr_avx2(auVar80,auVar90,4);
                auVar64 = vpmaddwd_avx2(auVar62,auVar71);
                auVar62 = vpalignr_avx2(auVar80,auVar90,8);
                auVar62 = vpmaddwd_avx2(auVar76,auVar62);
                auVar62 = vpaddd_avx2(auVar62,auVar64);
                auVar64 = vpalignr_avx2(auVar80,auVar90,0xc);
                auVar71 = vpmaddwd_avx2(auVar72,auVar64);
                auVar12._4_4_ = iVar40;
                auVar12._0_4_ = iVar40;
                auVar12._8_4_ = iVar40;
                auVar12._12_4_ = iVar40;
                auVar12._16_4_ = iVar40;
                auVar12._20_4_ = iVar40;
                auVar12._24_4_ = iVar40;
                auVar12._28_4_ = iVar40;
                auVar64 = vpaddd_avx2(auVar70,auVar12);
                auVar62 = vpaddd_avx2(auVar64,auVar62);
                auVar62 = vpaddd_avx2(auVar62,auVar71);
                auVar62 = vpsrad_avx2(auVar62,ZEXT416(uVar3));
                *pauVar47 = auVar62;
                lVar37 = lVar37 + 1;
                pauVar47 = pauVar47 + 1;
                iVar57 = iVar57 + iVar46;
                lVar28 = lVar28 + 1;
              } while (lVar37 < lVar43);
              goto LAB_0046a2f7;
            }
          }
LAB_0046a5b9:
          iVar32 = iVar32 + 8;
          local_474 = local_474 + 8;
        } while (iVar32 < p_width);
      }
      iVar50 = iVar50 + 8;
      local_48c = local_48c + p_stride * 8;
    } while (iVar50 < p_height);
  }
  return;
}

Assistant:

void av1_highbd_warp_affine_avx2(const int32_t *mat, const uint16_t *ref,
                                 int width, int height, int stride,
                                 uint16_t *pred, int p_col, int p_row,
                                 int p_width, int p_height, int p_stride,
                                 int subsampling_x, int subsampling_y, int bd,
                                 ConvolveParams *conv_params, int16_t alpha,
                                 int16_t beta, int16_t gamma, int16_t delta) {
  __m256i tmp[15];
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int max_bits_horiz = bd + FILTER_BITS + 1 - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  (void)max_bits_horiz;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i reduce_bits_vert_shift = _mm_cvtsi32_si128(reduce_bits_vert);
  const __m256i reduce_bits_vert_const =
      _mm256_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m256i res_add_const = _mm256_set1_epi32(1 << offset_bits_vert);
  const __m256i res_sub_const =
      _mm256_set1_epi32(-(1 << (offset_bits - conv_params->round_1)) -
                        (1 << (offset_bits - conv_params->round_1 - 1)));
  __m128i round_bits_shift = _mm_cvtsi32_si128(round_bits);
  __m256i round_bits_const = _mm256_set1_epi32(((1 << round_bits) >> 1));

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);

  __m256i v_rbhoriz = _mm256_set1_epi32(1 << (reduce_bits_horiz - 1));
  __m256i v_zeros = _mm256_setzero_si256();
  int ohoriz = 1 << offset_bits_horiz;
  int mhoriz = 1 << max_bits_horiz;
  (void)mhoriz;
  int sx;

  for (int i = 0; i < p_height; i += 8) {
    for (int j = 0; j < p_width; j += 8) {
      // Calculate the center of this 8x8 block,
      // project to luma coordinates (if in a subsampled chroma plane),
      // apply the affine transformation,
      // then convert back to the original coordinates (if necessary)
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      const int16_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      const int16_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      sx4 += alpha * (-4) + beta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
      sy4 += gamma * (-4) + delta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      if (ix4 <= -7) {
        for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm256_cvtepi16_epi32(_mm_set1_epi16(
              (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
              ref[iy * stride] * (1 << (FILTER_BITS - reduce_bits_horiz))));
        }
      } else if (ix4 >= width + 6) {
        for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm256_cvtepi16_epi32(
              _mm_set1_epi16((1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
                             ref[iy * stride + (width - 1)] *
                                 (1 << (FILTER_BITS - reduce_bits_horiz))));
        }
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        int32_t tmp1[8];
        for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
          const int iy = clamp(iy4 + k, 0, height - 1);

          sx = sx4 + beta * (k + 4);
          for (int l = -4; l < 4; ++l) {
            int ix = ix4 + l - 3;
            const int offs = sx >> WARPEDDIFF_PREC_BITS;
            const int16_t *coeffs = av1_warped_filter[offs];

            int32_t sum = 1 << offset_bits_horiz;
            for (int m = 0; m < 8; ++m) {
              const int sample_x = clamp(ix + m, 0, width - 1);
              sum += ref[iy * stride + sample_x] * coeffs[m];
            }
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_horiz);
            tmp1[(l + 4) / 2 + ((l + 4) % 2) * 4] = sum;
            sx += alpha;
          }
          tmp[k + 7] = _mm256_loadu_si256((__m256i *)tmp1);
        }
      } else {
        if (beta == 0 && alpha == 0) {
          sx = sx4;
          __m128i v_01 = _mm_loadu_si128(
              (__m128i *)
                  av1_warped_filter[sx >>
                                    WARPEDDIFF_PREC_BITS]);  // A7A6A5A4A3A2A1A0
          __m256i v_c01 = _mm256_broadcastd_epi32(v_01);     // A1A0A1A0A1A0A1A0
          __m256i v_c23 = _mm256_broadcastd_epi32(
              _mm_shuffle_epi32(v_01, 1));  // A3A2A3A2A3A2A3A2
          __m256i v_c45 = _mm256_broadcastd_epi32(
              _mm_shuffle_epi32(v_01, 2));  // A5A4A5A4A5A4A5A4
          __m256i v_c67 = _mm256_broadcastd_epi32(
              _mm_shuffle_epi32(v_01, 3));  // A7A6A7A6A7A6A7A6
          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum = _mm256_madd_epi16(
                v_c01, _mm256_alignr_epi8(v_refu, v_refl,
                                          0));  // R8R7R6..R1R7R6R5..R1R0
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum = _mm256_madd_epi16(
                v_c23,
                _mm256_alignr_epi8(v_refu, v_refl, 4));  // R10R9..R3R9R8..R3R2
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum = _mm256_madd_epi16(
                v_c45, _mm256_alignr_epi8(v_refu, v_refl,
                                          8));  // R12R11..R5R11R10..R5R4
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(
                v_c67, _mm256_alignr_epi8(v_refu, v_refl,
                                          12));  // R14R13..R7R13R12..R7R6
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }
        } else if (alpha == 0) {
          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            sx = sx4 + beta * (k + 4);

            __m128i v_01 = _mm_loadu_si128(
                (__m128i *)av1_warped_filter
                    [sx >> WARPEDDIFF_PREC_BITS]);          // A7A6A5A4A3A2A1A0
            __m256i v_c01 = _mm256_broadcastd_epi32(v_01);  // A1A0A1A0A1A0A1A0
            __m256i v_c23 = _mm256_broadcastd_epi32(
                _mm_shuffle_epi32(v_01, 1));  // A3A2A3A2A3A2A3A2
            __m256i v_c45 = _mm256_broadcastd_epi32(
                _mm_shuffle_epi32(v_01, 2));  // A5A4A5A4A5A4A5A4
            __m256i v_c67 = _mm256_broadcastd_epi32(
                _mm_shuffle_epi32(v_01, 3));  // A7A6A7A6A7A6A7A6

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1

            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum =
                _mm256_madd_epi16(v_c01, _mm256_alignr_epi8(v_refu, v_refl, 0));
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum =
                _mm256_madd_epi16(v_c23, _mm256_alignr_epi8(v_refu, v_refl, 4));
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum =
                _mm256_madd_epi16(v_c45, _mm256_alignr_epi8(v_refu, v_refl, 8));
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(v_c67,
                                       _mm256_alignr_epi8(v_refu, v_refl, 12));
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }
        } else if (beta == 0) {
          sx = sx4;
          __m256i v_coeff01 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx) >> WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff01 = _mm256_inserti128_si256(
              v_coeff01,
              _mm_loadu_si128(
                  (__m128i *)
                      av1_warped_filter[(sx + alpha) >> WARPEDDIFF_PREC_BITS]),
              1);  // B7B6..B1B0A7A6..A1A0
          __m256i v_coeff23 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 2 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff23 = _mm256_inserti128_si256(
              v_coeff23,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 3 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              1);  // D7D6..D1D0C7C6..C1C0
          __m256i v_coeff45 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 4 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff45 = _mm256_inserti128_si256(
              v_coeff45,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 5 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              1);  // F7F6..F1F0E7E6..E1E0
          __m256i v_coeff67 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 6 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff67 = _mm256_inserti128_si256(
              v_coeff67,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 7 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              1);  // H7H6..H1H0G7G6..G1G0

          __m256i v_c0123 = _mm256_unpacklo_epi32(
              v_coeff01,
              v_coeff23);  // D3D2B3B2D1D0B1B0C3C2A3A2C1C0A1A0
          __m256i v_c0123u = _mm256_unpackhi_epi32(
              v_coeff01,
              v_coeff23);  // D7D6B7B6D5D4B5B4C7C6A7A6C5C4A5A4
          __m256i v_c4567 = _mm256_unpacklo_epi32(
              v_coeff45,
              v_coeff67);  // H3H2F3F2H1H0F1F0G3G2E3E2G1G0E1E0
          __m256i v_c4567u = _mm256_unpackhi_epi32(
              v_coeff45,
              v_coeff67);  // H7H6F7F6H5H4F5F4G7G6E7E6G5G4E5E4

          __m256i v_c01 = _mm256_unpacklo_epi64(
              v_c0123, v_c4567);  // H1H0F1F0D1D0B1B0G1G0E1E0C1C0A1A0
          __m256i v_c23 =
              _mm256_unpackhi_epi64(v_c0123, v_c4567);  // H3H2 ... A3A2
          __m256i v_c45 =
              _mm256_unpacklo_epi64(v_c0123u, v_c4567u);  // H5H4 ... A5A4
          __m256i v_c67 =
              _mm256_unpackhi_epi64(v_c0123u, v_c4567u);  // H7H6 ... A7A6

          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1

            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum = _mm256_madd_epi16(
                v_c01, _mm256_alignr_epi8(v_refu, v_refl,
                                          0));  // R8R7R6..R1R7R6R5..R1R0
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum = _mm256_madd_epi16(
                v_c23,
                _mm256_alignr_epi8(v_refu, v_refl, 4));  // R10R9..R3R9R8..R3R2
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum = _mm256_madd_epi16(
                v_c45, _mm256_alignr_epi8(v_refu, v_refl,
                                          8));  // R12R11..R5R11R10..R5R4
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(
                v_c67, _mm256_alignr_epi8(v_refu, v_refl,
                                          12));  // R14R13..R7R13R12..R7R6
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }

        } else {
          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            sx = sx4 + beta * (k + 4);

            __m256i v_coeff01 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx) >> WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff01 = _mm256_inserti128_si256(
                v_coeff01,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // B7B6..B1B0A7A6..A1A0
            __m256i v_coeff23 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 2 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff23 = _mm256_inserti128_si256(
                v_coeff23,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 3 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // D7D6..D1D0C7C6..C1C0
            __m256i v_coeff45 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 4 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff45 = _mm256_inserti128_si256(
                v_coeff45,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 5 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // F7F6..F1F0E7E6..E1E0
            __m256i v_coeff67 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 6 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff67 = _mm256_inserti128_si256(
                v_coeff67,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 7 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // H7H6..H1H0G7G6..G1G0

            __m256i v_c0123 = _mm256_unpacklo_epi32(
                v_coeff01,
                v_coeff23);  // D3D2B3B2D1D0B1B0C3C2A3A2C1C0A1A0
            __m256i v_c0123u = _mm256_unpackhi_epi32(
                v_coeff01,
                v_coeff23);  // D7D6B7B6D5D4B5B4C7C6A7A6C5C4A5A4
            __m256i v_c4567 = _mm256_unpacklo_epi32(
                v_coeff45,
                v_coeff67);  // H3H2F3F2H1H0F1F0G3G2E3E2G1G0E1E0
            __m256i v_c4567u = _mm256_unpackhi_epi32(
                v_coeff45,
                v_coeff67);  // H7H6F7F6H5H4F5F4G7G6E7E6G5G4E5E4

            __m256i v_c01 = _mm256_unpacklo_epi64(
                v_c0123, v_c4567);  // H1H0F1F0D1D0B1B0G1G0E1E0C1C0A1A0
            __m256i v_c23 =
                _mm256_unpackhi_epi64(v_c0123, v_c4567);  // H3H2 ... A3A2
            __m256i v_c45 =
                _mm256_unpacklo_epi64(v_c0123u, v_c4567u);  // H5H4 ... A5A4
            __m256i v_c67 =
                _mm256_unpackhi_epi64(v_c0123u, v_c4567u);  // H7H6 ... A7A6

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1

            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum =
                _mm256_madd_epi16(v_c01, _mm256_alignr_epi8(v_refu, v_refl, 0));
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum =
                _mm256_madd_epi16(v_c23, _mm256_alignr_epi8(v_refu, v_refl, 4));
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum =
                _mm256_madd_epi16(v_c45, _mm256_alignr_epi8(v_refu, v_refl, 8));
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(v_c67,
                                       _mm256_alignr_epi8(v_refu, v_refl, 12));
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }
        }
      }

      // Vertical filter
      for (int k = -4; k < AOMMIN(4, p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);
        const __m256i *src = tmp + (k + 4);

        __m256i v_coeff01 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128(
                (__m128i *)av1_warped_filter[(sy) >> WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff01 = _mm256_inserti128_si256(
            v_coeff01,
            _mm_loadu_si128(
                (__m128i *)
                    av1_warped_filter[(sy + gamma) >> WARPEDDIFF_PREC_BITS]),
            1);
        __m256i v_coeff23 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 2 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff23 = _mm256_inserti128_si256(
            v_coeff23,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 3 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            1);
        __m256i v_coeff45 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 4 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff45 = _mm256_inserti128_si256(
            v_coeff45,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 5 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            1);
        __m256i v_coeff67 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 6 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff67 = _mm256_inserti128_si256(
            v_coeff67,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 7 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            1);

        __m256i v_c0123 = _mm256_unpacklo_epi32(
            v_coeff01,
            v_coeff23);  // D3D2B3B2D1D0B1B0C3C2A3A2C1C0A1A0
        __m256i v_c0123u = _mm256_unpackhi_epi32(
            v_coeff01,
            v_coeff23);  // D7D6B7B6D5D4B5B4C7C6A7A6C5C4A5A4
        __m256i v_c4567 = _mm256_unpacklo_epi32(
            v_coeff45,
            v_coeff67);  // H3H2F3F2H1H0F1F0G3G2E3E2G1G0E1E0
        __m256i v_c4567u = _mm256_unpackhi_epi32(
            v_coeff45,
            v_coeff67);  // H7H6F7F6H5H4F5F4G7G6E7E6G5G4E5E4

        __m256i v_c01 = _mm256_unpacklo_epi64(
            v_c0123, v_c4567);  // H1H0F1F0D1D0B1B0G1G0E1E0C1C0A1A0
        __m256i v_c23 =
            _mm256_unpackhi_epi64(v_c0123, v_c4567);  // H3H2 ... A3A2
        __m256i v_c45 =
            _mm256_unpacklo_epi64(v_c0123u, v_c4567u);  // H5H4 ... A5A4
        __m256i v_c67 =
            _mm256_unpackhi_epi64(v_c0123u, v_c4567u);  // H7H6 ... A7A6

        __m256i v_src01l =
            _mm256_unpacklo_epi32(src[0], src[1]);  // T13T03T11T01T12T02T10T00
        __m256i v_src01u =
            _mm256_unpackhi_epi32(src[0], src[1]);  // T17T07T15T05T16T06T14T04
        __m256i v_sum =
            _mm256_madd_epi16(_mm256_packus_epi32(v_src01l, v_src01u),
                              v_c01);  // S7S5S3S1S6S4S2S0

        __m256i v_src23l = _mm256_unpacklo_epi32(src[2], src[3]);
        __m256i v_src23u = _mm256_unpackhi_epi32(src[2], src[3]);
        v_sum = _mm256_add_epi32(
            v_sum,
            _mm256_madd_epi16(_mm256_packus_epi32(v_src23l, v_src23u), v_c23));

        __m256i v_src45l = _mm256_unpacklo_epi32(src[4], src[5]);
        __m256i v_src45u = _mm256_unpackhi_epi32(src[4], src[5]);
        v_sum = _mm256_add_epi32(
            v_sum,
            _mm256_madd_epi16(_mm256_packus_epi32(v_src45l, v_src45u), v_c45));

        __m256i v_src67l = _mm256_unpacklo_epi32(src[6], src[7]);
        __m256i v_src67u = _mm256_unpackhi_epi32(src[6], src[7]);
        v_sum = _mm256_add_epi32(
            v_sum,
            _mm256_madd_epi16(_mm256_packus_epi32(v_src67l, v_src67u), v_c67));

        // unpack S7S5S3S1S6S4S2S0 to S7S6S5S4S3S2S1S0

        __m256i v_suml =
            _mm256_permute4x64_epi64(v_sum, 0xD8);  // S7S5S6S4S3S1S2S0
        __m256i v_sumh =
            _mm256_permute4x64_epi64(v_sum, 0x32);      // S2S0S7S5S2S0S3S1
        v_sum = _mm256_unpacklo_epi32(v_suml, v_sumh);  // S7S6S5S4S3S2S1S0

        if (conv_params->is_compound) {
          __m128i *const p =
              (__m128i *)&conv_params
                  ->dst[(i + k + 4) * conv_params->dst_stride + j];

          v_sum = _mm256_add_epi32(v_sum, res_add_const);
          v_sum =
              _mm256_sra_epi32(_mm256_add_epi32(v_sum, reduce_bits_vert_const),
                               reduce_bits_vert_shift);
          if (conv_params->do_average) {
            __m128i *const dst16 = (__m128i *)&pred[(i + k + 4) * p_stride + j];
            __m256i p_32 = _mm256_cvtepu16_epi32(_mm_loadu_si128(p));

            if (conv_params->use_dist_wtd_comp_avg) {
              v_sum = _mm256_add_epi32(_mm256_mullo_epi32(p_32, wt0),
                                       _mm256_mullo_epi32(v_sum, wt1));
              v_sum = _mm256_srai_epi32(v_sum, DIST_PRECISION_BITS);
            } else {
              v_sum = _mm256_srai_epi32(_mm256_add_epi32(p_32, v_sum), 1);
            }

            __m256i v_sum1 = _mm256_add_epi32(v_sum, res_sub_const);
            v_sum1 = _mm256_sra_epi32(
                _mm256_add_epi32(v_sum1, round_bits_const), round_bits_shift);

            __m256i v_sum16 = _mm256_packus_epi32(v_sum1, v_sum1);
            v_sum16 = _mm256_permute4x64_epi64(v_sum16, 0xD8);
            v_sum16 = _mm256_min_epi16(v_sum16, clip_pixel);
            _mm_storeu_si128(dst16, _mm256_extracti128_si256(v_sum16, 0));
          } else {
            v_sum = _mm256_packus_epi32(v_sum, v_sum);
            __m256i v_sum16 = _mm256_permute4x64_epi64(v_sum, 0xD8);
            _mm_storeu_si128(p, _mm256_extracti128_si256(v_sum16, 0));
          }
        } else {
          // Round and pack into 8 bits
          const __m256i round_const =
              _mm256_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                                ((1 << reduce_bits_vert) >> 1));

          __m256i v_sum1 = _mm256_srai_epi32(
              _mm256_add_epi32(v_sum, round_const), reduce_bits_vert);

          v_sum1 = _mm256_packus_epi32(v_sum1, v_sum1);
          __m256i v_sum16 = _mm256_permute4x64_epi64(v_sum1, 0xD8);
          // Clamp res_16bit to the range [0, 2^bd - 1]
          const __m256i max_val = _mm256_set1_epi16((1 << bd) - 1);
          const __m256i zero = _mm256_setzero_si256();
          v_sum16 = _mm256_max_epi16(_mm256_min_epi16(v_sum16, max_val), zero);

          __m128i *const p = (__m128i *)&pred[(i + k + 4) * p_stride + j];

          _mm_storeu_si128(p, _mm256_extracti128_si256(v_sum16, 0));
        }
      }
    }
  }
}